

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O0

map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
* anon_unknown.dwarf_237ecec::ComputeTxHashInfo(Index *index,PriorityComputer *computer)

{
  long lVar1;
  bool bVar2;
  State SVar3;
  mapped_type *pmVar4;
  map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  TxHashInfo *info;
  Announcement *ann;
  Index *__range1;
  map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
  *ret;
  const_iterator __end1;
  const_iterator __begin1;
  Announcement *in_stack_ffffffffffffff48;
  Announcement *in_stack_ffffffffffffff50;
  PriorityComputer *in_stack_ffffffffffffff58;
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *in_stack_ffffffffffffff60;
  key_type *in_stack_ffffffffffffff68;
  map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
  *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
  ::map((map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
         *)in_stack_ffffffffffffff48);
  boost::multi_index::detail::
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  ::begin(in_stack_ffffffffffffff60);
  boost::multi_index::detail::
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  ::end(in_stack_ffffffffffffff60);
  while (bVar2 = boost::operators_impl::operator!=
                           ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                             *)in_stack_ffffffffffffff58,
                            (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                             *)in_stack_ffffffffffffff50), bVar2) {
    boost::multi_index::detail::
    bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
    ::operator*((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                 *)in_stack_ffffffffffffff48);
    pmVar4 = std::
             map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
             ::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    SVar3 = Announcement::GetState(in_stack_ffffffffffffff48);
    pmVar4->m_candidate_delayed = (ulong)(SVar3 == CANDIDATE_DELAYED) + pmVar4->m_candidate_delayed;
    SVar3 = Announcement::GetState(in_stack_ffffffffffffff48);
    pmVar4->m_candidate_ready = (ulong)(SVar3 == CANDIDATE_READY) + pmVar4->m_candidate_ready;
    SVar3 = Announcement::GetState(in_stack_ffffffffffffff48);
    pmVar4->m_candidate_best = (ulong)(SVar3 == CANDIDATE_BEST) + pmVar4->m_candidate_best;
    SVar3 = Announcement::GetState(in_stack_ffffffffffffff48);
    pmVar4->m_requested = (ulong)(SVar3 == REQUESTED) + pmVar4->m_requested;
    SVar3 = Announcement::GetState(in_stack_ffffffffffffff48);
    if (SVar3 == CANDIDATE_BEST) {
      in_stack_ffffffffffffff70 =
           (map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
            *)PriorityComputer::operator()(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      pmVar4->m_priority_candidate_best = (Priority)in_stack_ffffffffffffff70;
    }
    SVar3 = Announcement::GetState(in_stack_ffffffffffffff48);
    if (SVar3 == CANDIDATE_READY) {
      in_stack_ffffffffffffff68 =
           (key_type *)
           PriorityComputer::operator()(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff58 =
           (PriorityComputer *)
           std::max<unsigned_long>
                     ((unsigned_long *)in_stack_ffffffffffffff50,
                      (unsigned_long *)in_stack_ffffffffffffff48);
      pmVar4->m_priority_best_candidate_ready = in_stack_ffffffffffffff58->m_k0;
    }
    _GLOBAL__N_1::std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffff58,
               (value_type_conflict6 *)in_stack_ffffffffffffff50);
    boost::multi_index::detail::
    bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
    ::operator++((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>
                  *)in_stack_ffffffffffffff48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::map<uint256, TxHashInfo> ComputeTxHashInfo(const Index& index, const PriorityComputer& computer)
{
    std::map<uint256, TxHashInfo> ret;
    for (const Announcement& ann : index) {
        TxHashInfo& info = ret[ann.m_txhash];
        // Classify how many announcements of each state we have for this txhash.
        info.m_candidate_delayed += (ann.GetState() == State::CANDIDATE_DELAYED);
        info.m_candidate_ready += (ann.GetState() == State::CANDIDATE_READY);
        info.m_candidate_best += (ann.GetState() == State::CANDIDATE_BEST);
        info.m_requested += (ann.GetState() == State::REQUESTED);
        // And track the priority of the best CANDIDATE_READY/CANDIDATE_BEST announcements.
        if (ann.GetState() == State::CANDIDATE_BEST) {
            info.m_priority_candidate_best = computer(ann);
        }
        if (ann.GetState() == State::CANDIDATE_READY) {
            info.m_priority_best_candidate_ready = std::max(info.m_priority_best_candidate_ready, computer(ann));
        }
        // Also keep track of which peers this txhash has an announcement for (so we can detect duplicates).
        info.m_peers.push_back(ann.m_peer);
    }
    return ret;
}